

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidEdgeGeometry(ON_Brep *this,int edge_index,ON_TextLog *text_log)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ON_BrepEdge *pOVar5;
  int vi1;
  int vi0;
  ON_BrepEdge *edge;
  ON_TextLog *text_log_local;
  int edge_index_local;
  ON_Brep *this_local;
  
  if ((edge_index < 0) ||
     (iVar2 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E),
     iVar2 <= edge_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      uVar3 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
      ON_TextLog::Print(text_log,"brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n"
                        ,(ulong)(uint)edge_index,(ulong)uVar3);
    }
    this_local._7_1_ = false;
  }
  else {
    pOVar5 = ON_ClassArray<ON_BrepEdge>::operator[]
                       ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,edge_index);
    if (pOVar5->m_edge_index == edge_index) {
      uVar3 = pOVar5->m_vi[0];
      uVar1 = pOVar5->m_vi[1];
      uVar4 = (*(pOVar5->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                _vptr_ON_Object[0x34])();
      if ((uVar4 & 1) == 0) {
        if (uVar3 == uVar1) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,
                              "edge.m_vi[0]=edge.m_vi[1]=%d but edge.IsClosed() is false.\n",
                              (ulong)uVar3);
            ON_TextLog::PopIndent(text_log);
          }
          return false;
        }
      }
      else if (uVar3 != uVar1) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,"edge.m_vi[]=(%d,%d) but edge.IsClosed() is true\n",
                            (ulong)uVar3,(ulong)uVar1);
          ON_TextLog::PopIndent(text_log);
        }
        return false;
      }
      this_local._7_1_ = true;
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"edge.m_edge_index = %d (should be %d).\n",
                          (ulong)(uint)pOVar5->m_edge_index,(ulong)(uint)edge_index);
        ON_TextLog::PopIndent(text_log);
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_Brep::IsValidEdgeGeometry( int edge_index, ON_TextLog* text_log ) const
{
  if ( edge_index < 0 || edge_index >= m_E.Count() )
  {
    if ( text_log )
      text_log->Print("brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n",
                      edge_index, m_E.Count());
    return false;
  }
  const ON_BrepEdge& edge = m_E[edge_index];
  if ( edge.m_edge_index != edge_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_edge_index = %d (should be %d).\n",
                       edge.m_edge_index, edge_index );
      text_log->PopIndent();
    }
    return false;
  }

  int vi0 = edge.m_vi[0];
  int vi1 = edge.m_vi[1];
  if ( edge.IsClosed() ) 
  {
    if ( vi0 != vi1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_vi[]=(%d,%d) but edge.IsClosed() is true\n",
                         vi0,vi1);
        text_log->PopIndent();
      }
      return false;
    }
  }
  else {
    if ( vi0 == vi1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_vi[0]=edge.m_vi[1]=%d but edge.IsClosed() is false.\n",
                         vi0);
        text_log->PopIndent();
      }
      return false;
    }
  }

  return true;
}